

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::num_writer>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
           *this,int num_digits,string_view prefix,basic_format_specs<char> *spec,num_writer f)

{
  alignment aVar1;
  uint uVar2;
  char_type cVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  align_spec as;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::num_writer>
  local_50;
  
  local_50.prefix.size_ = prefix.size_;
  local_50.prefix.data_ = prefix.data_;
  uVar5 = (uint)num_digits + local_50.prefix.size_;
  local_50.fill = (char_type)(spec->super_align_spec).fill_;
  aVar1 = (spec->super_align_spec).align_;
  if (aVar1 == ALIGN_NUMERIC) {
    uVar4 = (ulong)(spec->super_align_spec).width_;
    local_50.size_ = uVar4;
    if (uVar4 < uVar5) {
      local_50.size_ = uVar5;
    }
    local_50.padding = 0;
    if (uVar5 <= uVar4) {
      local_50.padding = uVar4 - uVar5;
    }
    as.align_ = (spec->super_align_spec).align_;
    as.width_ = (spec->super_align_spec).width_;
    as.fill_ = (spec->super_align_spec).fill_;
  }
  else {
    uVar2 = (spec->super_core_format_specs).precision;
    bVar6 = uVar2 - num_digits != 0;
    local_50.size_ = uVar5;
    if (bVar6 && num_digits <= (int)uVar2) {
      local_50.size_ = uVar2 + local_50.prefix.size_;
    }
    cVar3 = '0';
    if (!bVar6 || (int)uVar2 < num_digits) {
      cVar3 = local_50.fill;
    }
    local_50.fill = cVar3;
    local_50.padding = (ulong)(uVar2 - num_digits);
    if (!bVar6 || (int)uVar2 < num_digits) {
      local_50.padding = 0;
    }
    as.align_ = (spec->super_align_spec).align_;
    as.width_ = (spec->super_align_spec).width_;
    as.fill_ = (spec->super_align_spec).fill_;
    if (aVar1 == ALIGN_DEFAULT) {
      as.align_ = ALIGN_RIGHT;
    }
  }
  local_50.f.abs_value = f.abs_value;
  local_50.f.size = f.size;
  local_50.f.sep = f.sep;
  local_50.f._13_3_ = f._13_3_;
  write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::num_writer>>
            (this,&as,&local_50);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + internal::to_unsigned(num_digits);
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision > num_digits) {
      size = prefix.size() + internal::to_unsigned(spec.precision);
      padding = internal::to_unsigned(spec.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(as, padded_int_writer<F>{size, prefix, fill, padding, f});
  }